

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

Value __thiscall xmrig::CpuBackend::toJSON(CpuBackend *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Ch *pCVar1;
  CpuLaunchData *pCVar2;
  bool bVar3;
  AlgoVariant value;
  Config *this_00;
  CpuConfig *this_01;
  size_t sVar4;
  Document *pDVar5;
  long in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  CpuLaunchData *data;
  CpuLaunchData *this_02;
  undefined1 auVar7 [16];
  Value VVar8;
  Value threads;
  Value thread;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  undefined1 local_80 [24];
  undefined4 local_68;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  this_00 = Base::config(*(Base **)(doc->
                                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                   ).data_.s.str);
  this_01 = Config::cpu(this_00);
  (this->super_IBackend)._vptr_IBackend = (_func_int **)0x0;
  this->d_ptr = (CpuBackendPrivate *)0x0;
  *(undefined2 *)((long)&this->d_ptr + 6) = 3;
  local_a0.s = "type";
  local_a0.length = 4;
  (**(code **)((doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.n.i64 + 0x28))(doc);
  String::toJSON((String *)&threads);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_a0,&threads,allocator);
  local_40.s = "enabled";
  local_40.length = 7;
  bVar3 = (bool)(**(code **)((doc->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.n.i64 + 0x10))(doc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_40,bVar3,allocator);
  local_50.s = "hw-aes";
  local_50.length = 6;
  bVar3 = CpuConfig::isHwAES(this_01);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_50,bVar3,allocator);
  local_60.s = "priority";
  local_60.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,&local_60,this_01->m_priority,allocator);
  local_b0.s = "hugepages";
  local_b0.length = 9;
  CpuBackendPrivate::hugePages
            ((CpuBackendPrivate *)&threads,
             (int)*(undefined8 *)
                   ((long)&(doc->
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           ).data_ + 8),(Document *)0x2);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,&local_b0,&threads,allocator);
  local_80._16_8_ = "memory";
  local_68 = 6;
  sVar4 = CpuBackendPrivate::ways
                    ((CpuBackendPrivate *)
                     (doc->
                     super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ).data_.o.members);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)this,(StringRefType *)(local_80 + 0x10),sVar4 << 0x14,allocator);
  pCVar1 = (doc->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  uVar6 = extraout_RDX;
  if (*(long *)(pCVar1 + 0x48) != *(long *)(pCVar1 + 0x50)) {
    auVar7 = (**(code **)((doc->
                          super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ).data_.n.i64 + 0x20))(doc);
    uVar6 = auVar7._8_8_;
    if (auVar7._0_8_ != 0) {
      local_c0.s = "hashrate";
      local_c0.length = 8;
      pDVar5 = (Document *)
               (**(code **)((doc->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            ).data_.n.i64 + 0x20))(doc);
      Hashrate::toJSON((Hashrate *)&threads,pDVar5);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_c0,&threads,allocator);
      threads.data_.n = (Number)0x0;
      threads.data_.s.str = (Ch *)0x4000000000000;
      pCVar1 = (doc->
               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ).data_.s.str;
      pCVar2 = *(CpuLaunchData **)(pCVar1 + 0x50);
      pDVar5 = (Document *)0x0;
      for (this_02 = *(CpuLaunchData **)(pCVar1 + 0x48); this_02 != pCVar2; this_02 = this_02 + 1) {
        thread.data_.n = (Number)0x0;
        thread.data_.s.str = (Ch *)0x3000000000000;
        local_d0.s = "intensity";
        local_d0.length = 9;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&thread,&local_d0,this_02->intensity,allocator);
        local_e0.s = "affinity";
        local_e0.length = 8;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<long>(&thread,&local_e0,this_02->affinity,allocator);
        local_f0.s = "av";
        local_f0.length = 2;
        value = CpuLaunchData::av(this_02);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<xmrig::CnHash::AlgoVariant>(&thread,&local_f0,value,allocator);
        local_100.s = "hashrate";
        local_100.length = 8;
        sVar4 = (**(code **)((doc->
                             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             ).data_.n.i64 + 0x20))(doc);
        Hashrate::toJSON((Hashrate *)local_80,sVar4,pDVar5);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&thread,&local_100,
                    (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)local_80,allocator);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&threads,&thread,allocator);
        pDVar5 = (Document *)
                 ((long)&(pDVar5->
                         super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         ).data_ + 1);
      }
      local_90.s = "threads";
      local_90.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)this,&local_90,&threads,allocator);
      uVar6 = extraout_RDX_00;
    }
  }
  VVar8.data_.s.str = (Ch *)uVar6;
  VVar8.data_.n = (Number)this;
  return (Value)VVar8.data_;
}

Assistant:

rapidjson::Value xmrig::CpuBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator         = doc.GetAllocator();
    const CpuConfig &cpu    = d_ptr->controller->config()->cpu();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);
    out.AddMember("hw-aes",     cpu.isHwAES(), allocator);
    out.AddMember("priority",   cpu.priority(), allocator);

    out.AddMember("hugepages", d_ptr->hugePages(2, doc), allocator);
    out.AddMember("memory",    static_cast<uint64_t>(d_ptr->ways() * CnAlgo::CN_MEMORY), allocator);

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const CpuLaunchData &data : d_ptr->threads) {
        Value thread(kObjectType);
        thread.AddMember("intensity",   data.intensity, allocator);
        thread.AddMember("affinity",    data.affinity, allocator);
        thread.AddMember("av",          data.av(), allocator);
        thread.AddMember("hashrate",    hashrate()->toJSON(i, doc), allocator);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}